

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void exchange_particles(int nm1,int nm2)

{
  int iVar1;
  int receive_width;
  int receive_left;
  int send_width;
  int send_left;
  uint rank;
  int x_diff;
  int iVar2;
  int mod;
  
  if (exchange_particles(int,int)::particle_numbers == '\0') {
    iVar2 = __cxa_guard_acquire(&exchange_particles(int,int)::particle_numbers);
    if (iVar2 != 0) {
      exchange_particles::particle_numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      exchange_particles::particle_numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exchange_particles::particle_numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __cxa_atexit(std::vector<int,_std::allocator<int>_>::~vector,
                   &exchange_particles::particle_numbers,&__dso_handle);
      __cxa_guard_release(&exchange_particles(int,int)::particle_numbers);
    }
  }
  if (exchange_particles(int,int)::particles == '\0') {
    iVar2 = __cxa_guard_acquire(&exchange_particles(int,int)::particles);
    if (iVar2 != 0) {
      exchange_particles::particles.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      exchange_particles::particles.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      exchange_particles::particles.super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __cxa_atexit(std::vector<particle,_std::allocator<particle>_>::~vector,
                   &exchange_particles::particles,&__dso_handle);
      __cxa_guard_release(&exchange_particles(int,int)::particles);
    }
  }
  iVar1 = nz_global * ny_global * nm1;
  iVar2 = nz_global * ny_global * nm2;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  if ((int)((ulong)((long)exchange_particles::particle_numbers.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)exchange_particles::particle_numbers.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < iVar2) {
    std::vector<int,_std::allocator<int>_>::resize
              (&exchange_particles::particle_numbers,(long)iVar2);
  }
  iVar1 = 0;
  do {
    if (iVar1 == 2) {
      return;
    }
    if (iVar1 == mpi_rank % 2) {
      if (0 < mpi_rank) {
        rank = mpi_rank - 1;
        x_diff = nx_ich - nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[rank];
        receive_left = 0;
        receive_width = nm1;
        send_left = nm1;
        send_width = nm2;
LAB_0011a575:
        exchange_particle_slices
                  (send_left,send_width,receive_left,receive_width,rank,
                   &exchange_particles::particle_numbers,iVar2,&exchange_particles::particles,x_diff
                  );
      }
    }
    else if (mpi_rank < n_sr + -1) {
      rank = mpi_rank + 1;
      send_left = *(int *)psr._M_t.
                          super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                          .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl - (nm2 + nm1)
      ;
      receive_left = *(int *)psr._M_t.
                             super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                             .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl - nm2;
      x_diff = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[mpi_rank] - nx_ich;
      receive_width = nm2;
      send_width = nm1;
      goto LAB_0011a575;
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void exchange_particles(const int nm1, const int nm2) {
    static vector<int> particle_numbers{};
    static vector<particle> particles{};

    const int size1 = ny_global * nz_global * nm1;
    const int size2 = ny_global * nz_global * nm2;
    const int size = max(size1, size2);

    if (static_cast<int>(particle_numbers.size()) < size) {
        particle_numbers.resize(size);
    }

    for (int mod=0; mod<2; mod++) {

        // first even processes send, while odd receive, then vice versa
        if (mpi_rank % 2 == mod) {
            if (mpi_rank > 0) {
                exchange_particle_slices(nm1, nm2, 0, nm1, mpi_rank - 1, particle_numbers, size, particles,
                        -nx_sr[mpi_rank - 1] + nx_ich);
            }
        } else {
            if (mpi_rank < n_sr-1) {
                exchange_particle_slices(psr->get_nx() - nm2 - nm1, nm1, psr->get_nx() - nm2, nm2, mpi_rank + 1,
                        particle_numbers, size, particles, nx_sr[mpi_rank] - nx_ich);
            }
        }
    }

}